

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void TM4(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  byte bVar2;
  uint8_t *clip_table;
  uint8_t *clip;
  int y;
  int x;
  uint8_t *top_local;
  uint8_t *dst_local;
  
  bVar1 = top[-1];
  dst_local = dst;
  for (y = 0; y < 4; y = y + 1) {
    bVar2 = top[-2 - y];
    for (x = 0; x < 4; x = x + 1) {
      dst_local[x] = clip1[(ulong)top[x] + (long)(int)(uint)bVar2 + (0xff - (long)(int)(uint)bVar1)]
      ;
    }
    dst_local = dst_local + 0x20;
  }
  return;
}

Assistant:

static void TM4(uint8_t* WEBP_RESTRICT dst, const uint8_t* WEBP_RESTRICT top) {
  int x, y;
  const uint8_t* const clip = clip1 + 255 - top[-1];
  for (y = 0; y < 4; ++y) {
    const uint8_t* const clip_table = clip + top[-2 - y];
    for (x = 0; x < 4; ++x) {
      dst[x] = clip_table[top[x]];
    }
    dst += BPS;
  }
}